

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
reconstruct_chunk_table
          (exr_const_context_t_conflict ctxt,exr_const_priv_part_t part,uint64_t *chunktable)

{
  exr_result_t eVar1;
  uint64_t uVar2;
  size_t __n;
  void *__s;
  exr_const_priv_part_t in_RDX;
  exr_const_context_t_conflict in_RSI;
  long in_RDI;
  uint64_t *unaff_retaddr;
  int ci_1;
  int ci;
  size_t chunkbytes;
  exr_const_context_t_conflict in_stack_00000018;
  int partnum;
  int computed_ci;
  int found_ci;
  exr_const_priv_part_t curpart;
  uint64_t *curctable;
  uint64_t max_offset;
  uint64_t chunk_start;
  uint64_t offset_start;
  exr_result_t firstfailrv;
  exr_result_t rv;
  int local_70;
  int local_6c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  long lVar4;
  exr_const_priv_part_t in_stack_ffffffffffffffb8;
  exr_const_context_t_conflict p_Var5;
  ulong uVar6;
  uint64_t indexio;
  int local_28;
  exr_result_t local_4;
  
  local_28 = 0;
  iVar3 = 0;
  lVar4 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)(*(int *)(in_RDI + 0xc4) + -1) * 8);
  uVar2 = (long)*(int *)(lVar4 + 0xf4) * 8 + *(long *)(lVar4 + 0xf8);
  p_Var5 = (exr_const_context_t_conflict)**(long **)(in_RDI + 0x1d8);
  while (p_Var5 != in_RSI) {
    iVar3 = iVar3 + 1;
    p_Var5 = *(exr_const_context_t_conflict *)(*(long *)(in_RDI + 0x1d8) + (long)iVar3 * 8);
  }
  p_Var5 = (exr_const_context_t_conflict)0xffffffffffffffff;
  if (0 < *(long *)(in_RDI + 0x98)) {
    p_Var5 = *(exr_const_context_t_conflict *)(in_RDI + 0x98);
  }
  if (0 < iVar3) {
    lVar4 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)(iVar3 + -1) * 8);
    eVar1 = extract_chunk_table(in_stack_00000018,(exr_const_priv_part_t)chunkbytes,_ci_1,
                                unaff_retaddr);
    if (eVar1 != 0) {
      return eVar1;
    }
    uVar6 = uVar2;
    for (local_6c = 0; local_6c < *(int *)(lVar4 + 0xf4); local_6c = local_6c + 1) {
      if ((uVar6 < *(ulong *)(&in_stack_ffffffffffffffb8->part_index + (long)local_6c * 2)) &&
         (*(exr_const_context_t_conflict *)
           (&in_stack_ffffffffffffffb8->part_index + (long)local_6c * 2) < p_Var5)) {
        uVar6 = *(ulong *)(&in_stack_ffffffffffffffb8->part_index + (long)local_6c * 2);
      }
    }
    eVar1 = extract_chunk_size(p_Var5,in_stack_ffffffffffffffb8,(int)((ulong)lVar4 >> 0x20),
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (uint64_t *)CONCAT44(iVar3,in_stack_ffffffffffffffa0));
    if (eVar1 != 0) {
      return eVar1;
    }
  }
  eVar1 = 0;
  __n = (long)*(int *)((long)&(in_RSI->first_part).compression + 4) << 3;
  __s = (void *)(**(code **)(in_RDI + 0x58))(__n);
  if (__s == (void *)0x0) {
    local_4 = 1;
  }
  else {
    memset(__s,0,__n);
    for (local_70 = 0; local_70 < *(int *)((long)&(in_RSI->first_part).compression + 4);
        local_70 = local_70 + 1) {
      indexio = uVar2;
      if ((uVar2 <= *(ulong *)(&in_RDX->part_index + (long)local_70 * 2)) &&
         (*(exr_const_context_t_conflict *)(&in_RDX->part_index + (long)local_70 * 2) < p_Var5)) {
        indexio = *(uint64_t *)(&in_RDX->part_index + (long)local_70 * 2);
      }
      iVar3 = local_70;
      if (*(int *)((long)&in_RSI->output_file_offset + 4) == 1) {
        iVar3 = *(int *)((long)&(in_RSI->first_part).compression + 4) - (local_70 + 1);
      }
      uVar2 = indexio;
      eVar1 = read_and_validate_chunk_leader
                        (in_RSI,in_RDX,eVar1,indexio,(int *)indexio,(uint64_t *)p_Var5);
      if ((eVar1 != 0) && (indexio = 0, local_28 == 0)) {
        local_28 = eVar1;
      }
      if (((-1 < iVar3) && (iVar3 < *(int *)((long)&(in_RSI->first_part).compression + 4))) &&
         (*(long *)((long)__s + (long)iVar3 * 8) == 0)) {
        *(uint64_t *)((long)__s + (long)iVar3 * 8) = indexio;
      }
    }
    if (local_28 == 0) {
      memcpy(in_RDX,__s,__n);
    }
    (**(code **)(in_RDI + 0x60))(__s);
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

static exr_result_t
reconstruct_chunk_table (
    exr_const_context_t ctxt, exr_const_priv_part_t part, uint64_t* chunktable)
{
    exr_result_t          rv          = EXR_ERR_SUCCESS;
    exr_result_t          firstfailrv = EXR_ERR_SUCCESS;
    uint64_t              offset_start, chunk_start, max_offset;
    uint64_t*             curctable;
    exr_const_priv_part_t curpart = NULL;
    int                   found_ci, computed_ci, partnum = 0;
    size_t                chunkbytes;

    curpart      = ctxt->parts[ctxt->num_parts - 1];
    offset_start = curpart->chunk_table_offset;
    offset_start += sizeof (uint64_t) * (uint64_t) curpart->chunk_count;

    curpart = ctxt->parts[partnum];
    while (curpart != part)
    {
        ++partnum;
        curpart = ctxt->parts[partnum];
    }

    max_offset = (uint64_t) -1;
    if (ctxt->file_size > 0) max_offset = (uint64_t) ctxt->file_size;

    // for multi-part, need to start at the first part and extract everything, then
    // work our way back up to this one, then grab the end of the previous part
    if (partnum > 0)
    {
        curpart = ctxt->parts[partnum - 1];
        rv      = extract_chunk_table (ctxt, curpart, &curctable, &chunk_start);
        if (rv != EXR_ERR_SUCCESS) return rv;

        chunk_start = offset_start;
        for (int ci = 0; ci < curpart->chunk_count; ++ci)
        {
            if (curctable[ci] > chunk_start && curctable[ci] < max_offset)
                chunk_start = curctable[ci];
        }

        rv = extract_chunk_size (
            ctxt, curpart, partnum - 1, chunk_start, &offset_start);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    chunkbytes = (size_t) part->chunk_count * sizeof (uint64_t);
    curctable  = (uint64_t*) ctxt->alloc_fn (chunkbytes);
    if (!curctable) return EXR_ERR_OUT_OF_MEMORY;

    memset (curctable, 0, chunkbytes);
    for (int ci = 0; ci < part->chunk_count; ++ci)
    {
        if (chunktable[ci] >= offset_start && chunktable[ci] < max_offset)
        {
            offset_start = chunktable[ci];
        }
        chunk_start = offset_start;
        computed_ci = ci;
        if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
            computed_ci = part->chunk_count - (ci + 1);
        found_ci = computed_ci;

        rv = read_and_validate_chunk_leader (
            ctxt, part, partnum, chunk_start, &found_ci, &offset_start);
        if (rv != EXR_ERR_SUCCESS)
        {
            chunk_start = 0;
            if (firstfailrv == EXR_ERR_SUCCESS) firstfailrv = rv;
        }

        if (found_ci >= 0 && found_ci < part->chunk_count)
        {
            if (curctable[found_ci] == 0) curctable[found_ci] = chunk_start;
        }
    }
    if (firstfailrv == EXR_ERR_SUCCESS)
        memcpy (chunktable, curctable, chunkbytes);
    ctxt->free_fn (curctable);

    return firstfailrv;
}